

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask25_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0xb | uVar1;
  uVar2 = uVar2 >> 0x15;
  out[3] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0x1d | uVar2;
  uVar1 = uVar1 >> 3;
  out[4] = uVar1;
  uVar2 = in[6];
  out[4] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[5] = uVar2;
  uVar1 = in[7];
  out[5] = uVar1 << 0xf | uVar2;
  uVar1 = uVar1 >> 0x11;
  out[6] = uVar1;
  uVar2 = in[8];
  out[6] = uVar2 << 8 | uVar1;
  uVar2 = uVar2 >> 0x18;
  out[7] = uVar2;
  uVar2 = in[9] * 2 | uVar2;
  out[7] = uVar2;
  uVar1 = in[10];
  out[7] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[8] = uVar1;
  uVar2 = in[0xb];
  out[8] = uVar2 << 0x13 | uVar1;
  uVar2 = uVar2 >> 0xd;
  out[9] = uVar2;
  uVar1 = in[0xc];
  out[9] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[10] = uVar1;
  uVar1 = in[0xd] << 5 | uVar1;
  out[10] = uVar1;
  uVar2 = in[0xe];
  out[10] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[0xb] = uVar2;
  uVar1 = in[0xf];
  out[0xb] = uVar1 << 0x17 | uVar2;
  out[0xc] = uVar1 >> 9;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask25_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (25 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (25 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (25 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (25 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (25 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (25 - 16);
  ++in;

  return out + 1;
}